

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_krp.c
# Opt level: O2

void beltKRPStepG(octet *key_,size_t key_len,octet *header,void *state)

{
  octet *poVar1;
  
  poVar1 = beltH();
  u32From((u32 *)((long)state + 0x28),
          poVar1 + key_len * 2 + *(long *)((long)state + 0x20) * 4 + -0x60,4);
  u32From((u32 *)((long)state + 0x38),header,0x10);
  *(undefined8 *)((long)state + 0x48) = *state;
  *(undefined8 *)((long)state + 0x50) = *(undefined8 *)((long)state + 8);
  *(undefined8 *)((long)state + 0x58) = *(undefined8 *)((long)state + 0x10);
  *(undefined8 *)((long)state + 0x60) = *(undefined8 *)((long)state + 0x18);
  beltCompr((u32 *)((long)state + 0x48),(u32 *)((long)state + 0x28),(void *)((long)state + 0x68));
  u32To(key_,key_len,(u32 *)((long)state + 0x48));
  return;
}

Assistant:

void beltKRPStepG(octet key_[], size_t key_len, const octet header[16],
	void* state)
{
	belt_krp_st* st = (belt_krp_st*)state;
	// pre
	ASSERT(memIsValid(state, beltKRP_keep()));
	ASSERT(key_len == 16 || key_len == 24 || key_len == 32);
	ASSERT(key_len <= st->len);
	ASSERT(memIsDisjoint2(key_, key_len, state, beltKRP_keep()));
	ASSERT(memIsDisjoint2(header, 16, state, beltKRP_keep()));
	// полностью определить st->block
	u32From(st->block, beltH() + 4 * (st->len - 16) + 2 * (key_len - 16), 4);
	u32From(st->block + 4, header, 16);
	// применить belt-compr2
	beltBlockCopy(st->key_new, st->key);
	beltBlockCopy(st->key_new + 4, st->key + 4);
	beltCompr(st->key_new, st->block, st->stack);
	// выгрузить ключ
	u32To(key_, key_len, st->key_new);
}